

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O3

void lodepng::lodepng_icc_cleanup(LodePNGICC *icc)

{
  free(icc->trc[0].lut);
  free(icc->trc[1].lut);
  free(icc->trc[2].lut);
  return;
}

Assistant:

void lodepng_icc_cleanup(LodePNGICC* icc) {
  lodepng_icc_curve_cleanup(&icc->trc[0]);
  lodepng_icc_curve_cleanup(&icc->trc[1]);
  lodepng_icc_curve_cleanup(&icc->trc[2]);
}